

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O3

void __thiscall xercesc_4_0::ReaderMgr::cleanStackBackTo(ReaderMgr *this,XMLSize_t readerNum)

{
  XMLSize_t XVar1;
  XMLReader *pXVar2;
  ReaderData *pRVar3;
  RuntimeException *this_00;
  void *p;
  
  XVar1 = this->fCurReader->fReaderNum;
  p = (void *)readerNum;
  while( true ) {
    if (XVar1 == readerNum) {
      return;
    }
    if ((this->fReaderStack->fVector).super_BaseRefVectorOf<xercesc_4_0::ReaderMgr::ReaderData>.
        fCurCount == 0) break;
    pRVar3 = this->fCurReaderData;
    if (pRVar3 != (ReaderData *)0x0) {
      ReaderData::~ReaderData(pRVar3);
    }
    XMemory::operator_delete((XMemory *)pRVar3,p);
    pRVar3 = RefStackOf<xercesc_4_0::ReaderMgr::ReaderData>::pop(this->fReaderStack);
    this->fCurReaderData = pRVar3;
    pXVar2 = pRVar3->fReader;
    this->fCurReader = pXVar2;
    XVar1 = pXVar2->fReaderNum;
  }
  this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
  RuntimeException::RuntimeException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ReaderMgr.cpp"
             ,0x196,RdrMgr_ReaderIdNotFound,this->fMemoryManager);
  __cxa_throw(this_00,&RuntimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

void ReaderMgr::cleanStackBackTo(const XMLSize_t readerNum)
{
    //
    //  Just start popping readers until we find the one with the indicated
    //  reader number.
    //
    while (true)
    {
        if (fCurReader->getReaderNum() == readerNum)
            break;

        if (fReaderStack->empty())
            ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::RdrMgr_ReaderIdNotFound, fMemoryManager);

        delete fCurReaderData;
        fCurReaderData = fReaderStack->pop();
        fCurReader = fCurReaderData->getReader ();
    }
}